

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O1

void __thiscall
nonsugar::detail::parse_flag_long<std::__cxx11::string,boost::optional<int>,void>::operator()
          (parse_flag_long<std::__cxx11::string,boost::optional<int>,void> *this,
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *match,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *param_2,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          param_3,shared_ptr<boost::optional<int>_> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 *puVar7;
  undefined8 uVar8;
  pointer psVar9;
  pointer pcVar10;
  bool bVar11;
  shared_ptr<int> v;
  string_type local_98;
  string_type local_78;
  flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
  *local_58;
  long local_50;
  undefined1 local_48 [24];
  pointer local_30;
  
  psVar4 = (match->
           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ).
           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar9 = (match->
           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ).
           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 == psVar9) {
    bVar11 = false;
  }
  else {
    bVar11 = ((long)psVar9 - (long)psVar4 >> 3) * -0x5555555555555555 - 6U < 0xfffffffffffffffd;
  }
  psVar9 = psVar9 + -3;
  if (bVar11) {
    psVar9 = psVar4 + 2;
  }
  if (psVar9->matched == false) {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00169b98;
    *(undefined1 *)&p_Var6[1]._vptr__Sp_counted_base = 0;
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)(p_Var6 + 1);
    p_Var5 = (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
         = p_Var6;
    if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    return;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_98,match,2);
  if ((flg->read).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar8 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_58 != flg) {
      operator_delete(local_58,(ulong)(local_48._0_8_ + 1));
    }
    if (local_30 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
    }
    _Unwind_Resume(uVar8);
  }
  (*(flg->read)._M_invoker)
            ((_Any_data *)(local_48 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flg->read);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((uint *)local_48._16_8_ != (uint *)0x0) {
    uVar3 = *(uint *)local_48._16_8_;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00169b98;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)(((ulong)uVar3 << 0x20) + 1);
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)(p_Var6 + 1);
    p_Var5 = (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (value->super___shared_ptr<boost::optional<int>,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
         = p_Var6;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    goto LAB_0014e7a4;
  }
  local_58 = (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
              *)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"invalid argument: ","");
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::str(&local_78,match,0);
  pcVar10 = (pointer)0xf;
  if (local_58 !=
      (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
       *)local_48) {
    pcVar10 = (pointer)local_48._0_8_;
  }
  if (pcVar10 < (pointer)(local_78._M_string_length + local_50)) {
    uVar8 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar8 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < (pointer)(local_78._M_string_length + local_50)) goto LAB_0014e6ed;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
  }
  else {
LAB_0014e6ed:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
  }
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98.field_2._8_8_ = puVar7[3];
    local_98._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_98._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::operator=((string *)err,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,(ulong)(local_78.field_2._M_allocated_capacity + 1));
  }
  if (local_58 !=
      (flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__d_,_boost::optional<int>_>
       *)local_48) {
    operator_delete(local_58,(ulong)(local_48._0_8_ + 1));
  }
LAB_0014e7a4:
  if (local_30 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  return;
}

Assistant:

void operator()(
        std::match_results<typename String::const_iterator> const &match, Iterator &, Iterator,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        if (!match[2].matched) {
            value = std::make_shared<Value>();
        } else {
            auto const v = flg.read(match.str(2));
            if (!v) {
                err = widen<String>("invalid argument: ") + match.str(0);
                return;
            }
            value = copy_shared(optional_traits<Value>::construct(*v));
        }
    }